

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

void __thiscall Lowerer::GenerateFastInlineArrayPop(Lowerer *this,Instr *instr)

{
  Opnd *arrayOpnd;
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  undefined4 *puVar4;
  LabelInstr *target;
  LabelInstr *labelHelper;
  LabelInstr *pLVar5;
  anon_union_2_4_ea848c7b_for_ValueType_13 *this_00;
  LabelInstr *bailOutLabelHelper;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_3a;
  LabelInstr *local_38;
  
  if (instr->m_opcode != InlineArrayPop) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x4e80,"(instr->m_opcode == Js::OpCode::InlineArrayPop)",
                       "instr->m_opcode == Js::OpCode::InlineArrayPop");
    if (!bVar2) goto LAB_005a0291;
    *puVar4 = 0;
  }
  arrayOpnd = instr->m_src1;
  local_38 = IR::LabelInstr::New(Label,this->m_func,true);
  target = IR::LabelInstr::New(Label,this->m_func,false);
  local_3a = (arrayOpnd->m_valueType).field_0;
  this_00 = &local_3a;
  bVar2 = ValueType::IsLikelyNativeArray((ValueType *)&this_00->field_0);
  pLVar5 = (LabelInstr *)0x0;
  bVar3 = ShouldGenerateArrayFastPath((Lowerer *)&this_00->field_0,arrayOpnd,false,false,false);
  if (bVar3) {
    labelHelper = IR::LabelInstr::New(Label,this->m_func,true);
    bailOutLabelHelper = local_38;
    if (!bVar2) {
      bailOutLabelHelper = labelHelper;
    }
    GenerateFastPop(this,arrayOpnd,instr,labelHelper,pLVar5,bailOutLabelHelper);
    IR::Instr::InsertBefore(instr,&labelHelper->super_Instr);
    InsertBranch(Br,true,target,&labelHelper->super_Instr);
    IR::Instr::InsertAfter(instr,&target->super_Instr);
    if (!bVar2) goto LAB_005a0270;
LAB_005a024f:
    LowerOneBailOutKind(this,instr,BailOutConventionalNativeArrayAccessOnly,false,false);
    pLVar5 = local_38;
  }
  else {
    pLVar5 = target;
    if (bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x4ea0,"(!isLikelyNativeArray)","!isLikelyNativeArray");
      if (!bVar2) {
LAB_005a0291:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
      IR::Instr::InsertAfter(instr,&target->super_Instr);
      goto LAB_005a024f;
    }
  }
  IR::Instr::InsertAfter(instr,&pLVar5->super_Instr);
LAB_005a0270:
  GenerateHelperToArrayPopFastPath(this,instr,target,local_38);
  return;
}

Assistant:

void
Lowerer::GenerateFastInlineArrayPop(IR::Instr * instr)
{
    Assert(instr->m_opcode == Js::OpCode::InlineArrayPop);

    IR::Opnd *arrayOpnd = instr->GetSrc1();

    IR::LabelInstr *bailOutLabelHelper = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true);
    IR::LabelInstr *doneLabel = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);

    bool isLikelyNativeArray = arrayOpnd->GetValueType().IsLikelyNativeArray();

    if (ShouldGenerateArrayFastPath(arrayOpnd, false, false, false))
    {
        IR::LabelInstr *labelHelper = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true);

        if(isLikelyNativeArray)
        {
            //We bailOut on cases like length == 0, Array Test failing cases (Runtime helper cannot handle these cases)
            GenerateFastPop(arrayOpnd, instr, labelHelper, doneLabel, bailOutLabelHelper);
        }
        else
        {
            //We jump to helper on cases like length == 0, Array Test failing cases
            GenerateFastPop(arrayOpnd, instr, labelHelper, doneLabel, labelHelper);
        }

        instr->InsertBefore(labelHelper);

        ///JMP to $doneLabel
        InsertBranch(Js::OpCode::Br, true, doneLabel, labelHelper);
    }
    else
    {
        //We assume here that the array will be a Var array. - Runtime Helper calls assume this.
        Assert(!isLikelyNativeArray);
    }

    instr->InsertAfter(doneLabel);

    if(isLikelyNativeArray)
    {
        //Lower IR::BailOutConventionalNativeArrayAccessOnly here.
        LowerOneBailOutKind(instr, IR::BailOutConventionalNativeArrayAccessOnly, false, false);
        instr->InsertAfter(bailOutLabelHelper);
    }

    GenerateHelperToArrayPopFastPath(instr, doneLabel, bailOutLabelHelper);
}